

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O1

size_t fileRead2(void *buf,size_t count,file_t file)

{
  err_t eVar1;
  size_t in_RAX;
  size_t sVar2;
  size_t read;
  size_t local_8;
  
  local_8 = in_RAX;
  eVar1 = fileRead(&local_8,buf,count,file);
  sVar2 = 0xffffffffffffffff;
  if (0xfffffffd < eVar1 - 1) {
    sVar2 = local_8;
  }
  return sVar2;
}

Assistant:

size_t fileRead2(void* buf, size_t count, file_t file)
{
	err_t code;
	size_t read;
	code = fileRead(&read, buf, count, file);
	if (code != ERR_OK && code != ERR_MAX)
		return SIZE_MAX;
	return read;
}